

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int unqlite_create_constant
              (unqlite_vm *pVm,char *zName,_func_void_unqlite_value_ptr_void_ptr *xExpand,
              void *pUserData)

{
  char cVar1;
  char *pcVar2;
  uint uVar3;
  sxi32 sVar4;
  ushort **ppuVar5;
  long lVar6;
  char *pcVar7;
  SyString local_40;
  
  if (pVm == (unqlite_vm *)0x0) {
    return -0x18;
  }
  if (pVm->nMagic == 0xdead2bad) {
    return -0x18;
  }
  pcVar7 = zName;
  if (*zName != '\0') {
    pcVar2 = zName + 2;
    do {
      pcVar7 = pcVar2;
      if (pcVar7[-1] == '\0') {
        pcVar7 = pcVar7 + -1;
        goto LAB_0010c538;
      }
      if (*pcVar7 == '\0') goto LAB_0010c538;
      if (pcVar7[1] == '\0') {
        pcVar7 = pcVar7 + 1;
        goto LAB_0010c538;
      }
      pcVar2 = pcVar7 + 4;
    } while (pcVar7[2] != '\0');
    pcVar7 = pcVar7 + 2;
  }
LAB_0010c538:
  uVar3 = (int)pcVar7 - (int)zName;
  if (uVar3 == 0) {
    return -9;
  }
  lVar6 = 0;
  while ((cVar1 = zName[lVar6], (ulong)(long)cVar1 < 0xffffffffffffffc0 &&
         (ppuVar5 = __ctype_b_loc(), (*(byte *)((long)*ppuVar5 + (long)cVar1 * 2 + 1) & 0x20) != 0))
        ) {
    lVar6 = lVar6 + 1;
    if (uVar3 == (uint)lVar6) {
      return -9;
    }
  }
  local_40.zString = zName + lVar6;
  pcVar7 = zName + uVar3;
  lVar6 = (ulong)uVar3 - lVar6;
  while( true ) {
    pcVar7 = pcVar7 + -1;
    cVar1 = *pcVar7;
    if ((0xffffffffffffffbf < (ulong)(long)cVar1) ||
       (ppuVar5 = __ctype_b_loc(), (*(byte *)((long)*ppuVar5 + (long)cVar1 * 2 + 1) & 0x20) == 0))
    break;
    lVar6 = lVar6 + -1;
    if (lVar6 == 0) {
      return -9;
    }
  }
  local_40.nByte = (uint)lVar6;
  if (xExpand == (_func_void_unqlite_value_ptr_void_ptr *)0x0) {
    return -9;
  }
  sVar4 = jx9VmRegisterConstant(pVm->pJx9Vm,&local_40,(ProcConstant)xExpand,pUserData);
  return sVar4;
}

Assistant:

int unqlite_create_constant(unqlite_vm *pVm,const char *zName,void (*xExpand)(unqlite_value *, void *),void *pUserData)
{
	SyString sName;
	int rc;
	if( UNQLITE_VM_MISUSE(pVm) ){
		return UNQLITE_CORRUPT;
	}
	SyStringInitFromBuf(&sName, zName, SyStrlen(zName));
	/* Remove leading and trailing white spaces */
	SyStringFullTrim(&sName);
	if( sName.nByte < 1 ){
		/* Empty constant name */
		return UNQLITE_INVALID;
	}
	/* TICKET 1433-003: NULL pointer is harmless operation */
	if( xExpand == 0 ){
		return UNQLITE_INVALID;
	}
#if defined(UNQLITE_ENABLE_THREADS)
	 /* Acquire VM mutex */
	 SyMutexEnter(sUnqlMPGlobal.pMutexMethods, pVm->pMutex); /* NO-OP if sUnqlMPGlobal.nThreadingLevel != UNQLITE_THREAD_LEVEL_MULTI */
	 if( sUnqlMPGlobal.nThreadingLevel > UNQLITE_THREAD_LEVEL_SINGLE && 
		 UNQLITE_THRD_VM_RELEASE(pVm) ){
			 return UNQLITE_ABORT; /* Another thread have released this instance */
	 }
#endif
	 /* Install the foreign constant */
	 rc = jx9VmRegisterConstant(pVm->pJx9Vm,&sName,xExpand,pUserData);
#if defined(UNQLITE_ENABLE_THREADS)
	 /* Leave DB mutex */
	 SyMutexLeave(sUnqlMPGlobal.pMutexMethods,pVm->pMutex); /* NO-OP if sUnqlMPGlobal.nThreadingLevel != UNQLITE_THREAD_LEVEL_MULTI */
#endif
	return rc;
}